

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

double __thiscall libsgp4::DateTime::AbsoluteDays(DateTime *this,uint year,double doy)

{
  ulong uVar1;
  int64_t daysSoFar;
  int64_t previousYear;
  double doy_local;
  uint year_local;
  DateTime *this_local;
  
  uVar1 = (ulong)(year - 1);
  return ((double)(long)(((uVar1 * 0x16d + uVar1 / 4) - uVar1 / 100) + uVar1 / 400) + doy) - 1.0;
}

Assistant:

double AbsoluteDays(unsigned int year, double doy) const
    {
        int64_t previousYear = year - 1;

        /*
         * + days in previous years ignoring leap days
         * + Julian leap days before this year
         * - minus prior century years
         * + plus prior years divisible by 400 days
         */
        int64_t daysSoFar = 365 * previousYear
            + previousYear / 4LL
            - previousYear / 100LL
            + previousYear / 400LL;

        return static_cast<double>(daysSoFar) + doy - 1.0;
    }